

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmListFileContext * __thiscall
cmMakefile::GetExecutionContext(cmListFileContext *__return_storage_ptr__,cmMakefile *this)

{
  const_reference pvVar1;
  cmMakefile *this_local;
  
  pvVar1 = std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::
           back(&this->CallStack);
  cmListFileContext::cmListFileContext(__return_storage_ptr__,pvVar1->Context);
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmMakefile::GetExecutionContext() const
{
  return *this->CallStack.back().Context;
}